

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O0

bool Js::TypedArrayBase::TryGetLengthForOptimizedTypedArray
               (Var var,uint32 *lengthRef,TypeId *typeIdRef)

{
  code *pcVar1;
  bool bVar2;
  TypeId TVar3;
  undefined4 *puVar4;
  RecyclableObject *this;
  TypedArrayBase *this_00;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_30;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_2e;
  TypeId local_2c;
  TypeId *pTStack_28;
  TypeId typeId;
  TypeId *typeIdRef_local;
  uint32 *lengthRef_local;
  Var var_local;
  
  pTStack_28 = typeIdRef;
  typeIdRef_local = lengthRef;
  lengthRef_local = (uint32 *)var;
  if (var == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0x927,"(var)","var");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (typeIdRef_local == (TypeId *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0x928,"(lengthRef)","lengthRef");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (pTStack_28 == (TypeId *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0x929,"(typeIdRef)","typeIdRef");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  bVar2 = VarIs<Js::RecyclableObject>(lengthRef_local);
  if (bVar2) {
    this = VarTo<Js::RecyclableObject>(lengthRef_local);
    local_2c = RecyclableObject::GetTypeId(this);
    if (local_2c - TypeIds_Int8Array < 9) {
      local_2e.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::FromTypeId(local_2c,false);
      bVar2 = ValueType::IsOptimizedTypedArray((ValueType *)&local_2e.field_0);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                    ,0x93c,
                                    "(ValueType::FromTypeId(typeId,false).IsOptimizedTypedArray())",
                                    "ValueType::FromTypeId(typeId,false).IsOptimizedTypedArray()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      this_00 = VarTo<Js::TypedArrayBase>(lengthRef_local);
      TVar3 = ArrayObject::GetLength((ArrayObject *)this_00);
      *typeIdRef_local = TVar3;
      *pTStack_28 = local_2c;
      var_local._7_1_ = true;
    }
    else {
      local_30.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::FromTypeId(local_2c,false);
      bVar2 = ValueType::IsOptimizedTypedArray((ValueType *)&local_30.field_0);
      if (bVar2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                    ,0x942,
                                    "(!ValueType::FromTypeId(typeId,false).IsOptimizedTypedArray())"
                                    ,"!ValueType::FromTypeId(typeId,false).IsOptimizedTypedArray()")
        ;
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      var_local._7_1_ = false;
    }
  }
  else {
    var_local._7_1_ = false;
  }
  return var_local._7_1_;
}

Assistant:

bool TypedArrayBase::TryGetLengthForOptimizedTypedArray(const Var var, uint32 *const lengthRef, TypeId *const typeIdRef)
    {
        Assert(var);
        Assert(lengthRef);
        Assert(typeIdRef);

        if(!VarIs<RecyclableObject>(var))
        {
            return false;
        }

        const TypeId typeId = VarTo<RecyclableObject>(var)->GetTypeId();
        switch(typeId)
        {
            case TypeIds_Int8Array:
            case TypeIds_Uint8Array:
            case TypeIds_Uint8ClampedArray:
            case TypeIds_Int16Array:
            case TypeIds_Uint16Array:
            case TypeIds_Int32Array:
            case TypeIds_Uint32Array:
            case TypeIds_Float32Array:
            case TypeIds_Float64Array:
                Assert(ValueType::FromTypeId(typeId,false).IsOptimizedTypedArray());
                *lengthRef = VarTo<TypedArrayBase>(var)->GetLength();
                *typeIdRef = typeId;
                return true;
        }

        Assert(!ValueType::FromTypeId(typeId,false).IsOptimizedTypedArray());
        return false;
    }